

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse(parser *this,FILE *s)

{
  undefined1 local_2078 [8];
  parser p;
  file_reader r;
  FILE *s_local;
  
  file_reader::file_reader((file_reader *)&p.m_convert_numbers,s,0xa00000,true);
  parser((parser *)local_2078,(reader *)&p.m_convert_numbers,true,0x19000,1000,true,true,true);
  parse(this);
  file_reader::~file_reader((file_reader *)&p.m_convert_numbers);
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse(FILE *s)
{
    file_reader r(s, max_message_length, true);
    parser p(r);
    return p.parse();
}